

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope_eval.cxx
# Opt level: O1

float bez2_time(float x0,float x1,float x2,float x3,float time,float *t0,float *t1)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar2 = (x1 - x0) * 3.0;
  fVar3 = (x2 - x1) * 3.0 - fVar2;
  while( true ) {
    fVar4 = (*t1 - *t0) * 0.5 + *t0;
    fVar5 = fVar2 * fVar4 +
            fVar4 * fVar4 * fVar3 + fVar4 * fVar4 * fVar4 * (((x3 - x0) - fVar2) - fVar3) + x0;
    if (ABS(time - fVar5) <= 0.0001) break;
    pfVar1 = t0;
    if (time < fVar5) {
      pfVar1 = t1;
    }
    *pfVar1 = fVar4;
  }
  return fVar4;
}

Assistant:

static float bez2_time(float x0, float x1, float x2, float x3, float time,
		float* t0, float* t1)
{
	float t = *t0 + (*t1 - *t0)*0.5f;
	float v = bezier(x0, x1, x2, x3, t);
	if (std::abs(time - v) > 1e-4f) {
		if (v > time)
			*t1 = t;
		else
			*t0 = t;
		return bez2_time(x0, x1, x2, x3, time, t0, t1);
	} else {
		return t;
	}
}